

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_spr_power8_tm(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x80].name == (char *)0x0) && (env->spr[0x80] == 0)) &&
      (env->spr_cb[0x80].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x80].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x80].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x80].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x80].name = "TFHAR";
    env->spr_cb[0x80].uea_read = spr_read_tm;
    env->spr_cb[0x80].uea_write = spr_write_tm;
    env->spr_cb[0x80].oea_read = spr_read_tm;
    env->spr_cb[0x80].oea_write = spr_write_tm;
    env->spr_cb[0x80].hea_read = spr_read_tm;
    env->spr_cb[0x80].hea_write = spr_write_tm;
    env->spr_cb[0x80].default_value = 0;
    env->spr[0x80] = 0;
    if (((env->spr_cb[0x81].name == (char *)0x0) && (env->spr[0x81] == 0)) &&
       ((env->spr_cb[0x81].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x81].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x81].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x81].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x81].name = "TFIAR";
      env->spr_cb[0x81].uea_read = spr_read_tm;
      env->spr_cb[0x81].uea_write = spr_write_tm;
      env->spr_cb[0x81].oea_read = spr_read_tm;
      env->spr_cb[0x81].oea_write = spr_write_tm;
      env->spr_cb[0x81].hea_read = spr_read_tm;
      env->spr_cb[0x81].hea_write = spr_write_tm;
      env->spr_cb[0x81].default_value = 0;
      env->spr[0x81] = 0;
      if (((env->spr_cb[0x82].name == (char *)0x0) && (env->spr[0x82] == 0)) &&
         (((env->spr_cb[0x82].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x82].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x82].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x82].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x82].name = "TEXASR";
        env->spr_cb[0x82].uea_read = spr_read_tm;
        env->spr_cb[0x82].uea_write = spr_write_tm;
        env->spr_cb[0x82].oea_read = spr_read_tm;
        env->spr_cb[0x82].oea_write = spr_write_tm;
        env->spr_cb[0x82].hea_read = spr_read_tm;
        env->spr_cb[0x82].hea_write = spr_write_tm;
        env->spr_cb[0x82].default_value = 0;
        env->spr[0x82] = 0;
        if (((((env->spr_cb[0x83].name == (char *)0x0) && (env->spr[0x83] == 0)) &&
             (env->spr_cb[0x83].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            ((env->spr_cb[0x83].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x83].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
           (env->spr_cb[0x83].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
          env->spr_cb[0x83].name = "TEXASRU";
          env->spr_cb[0x83].uea_read = spr_read_tm_upper32;
          env->spr_cb[0x83].uea_write = spr_write_tm_upper32;
          env->spr_cb[0x83].oea_read = spr_read_tm_upper32;
          env->spr_cb[0x83].oea_write = spr_write_tm_upper32;
          env->spr_cb[0x83].hea_read = spr_read_tm_upper32;
          env->spr_cb[0x83].hea_write = spr_write_tm_upper32;
          env->spr_cb[0x83].default_value = 0;
          env->spr[0x83] = 0;
          return;
        }
        uVar2 = 0x83;
        uVar1 = 0x83;
      }
      else {
        uVar2 = 0x82;
        uVar1 = 0x82;
      }
    }
    else {
      uVar2 = 0x81;
      uVar1 = 0x81;
    }
  }
  else {
    uVar2 = 0x80;
    uVar1 = 0x80;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_power8_tm(CPUPPCState *env)
{
    spr_register_kvm(env, SPR_TFHAR, "TFHAR",
                     &spr_read_tm, &spr_write_tm,
                     &spr_read_tm, &spr_write_tm,
                     KVM_REG_PPC_TFHAR, 0x00000000);
    spr_register_kvm(env, SPR_TFIAR, "TFIAR",
                     &spr_read_tm, &spr_write_tm,
                     &spr_read_tm, &spr_write_tm,
                     KVM_REG_PPC_TFIAR, 0x00000000);
    spr_register_kvm(env, SPR_TEXASR, "TEXASR",
                     &spr_read_tm, &spr_write_tm,
                     &spr_read_tm, &spr_write_tm,
                     KVM_REG_PPC_TEXASR, 0x00000000);
    spr_register(env, SPR_TEXASRU, "TEXASRU",
                 &spr_read_tm_upper32, &spr_write_tm_upper32,
                 &spr_read_tm_upper32, &spr_write_tm_upper32,
                 0x00000000);
}